

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicationFactory.cpp
# Opt level: O0

unique_ptr<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>_>
 __thiscall ApplicationFactory::makeEventsProcessor(ApplicationFactory *this,Context *context)

{
  unique_ptr<solitaire::events::SDLEventsSource,_std::default_delete<solitaire::events::SDLEventsSource>_>
  *in_RDX;
  unique_ptr<solitaire::SDL::Wrapper,_std::default_delete<solitaire::SDL::Wrapper>_> local_38;
  unique_ptr<solitaire::SDL::Wrapper,_std::default_delete<solitaire::SDL::Wrapper>_> local_30;
  unique_ptr<solitaire::events::EventsProcessor,_std::default_delete<solitaire::events::EventsProcessor>_>
  local_28 [2];
  Context *context_local;
  ApplicationFactory *this_local;
  
  context_local = context;
  this_local = this;
  std::make_unique<solitaire::SDL::Wrapper>();
  std::
  make_unique<solitaire::events::SDLEventsSource,std::unique_ptr<solitaire::SDL::Wrapper,std::default_delete<solitaire::SDL::Wrapper>>>
            (&local_30);
  std::
  make_unique<solitaire::events::EventsProcessor,solitaire::interfaces::Context&,std::unique_ptr<solitaire::events::SDLEventsSource,std::default_delete<solitaire::events::SDLEventsSource>>>
            ((Context *)local_28,in_RDX);
  std::
  unique_ptr<solitaire::events::interfaces::EventsProcessor,std::default_delete<solitaire::events::interfaces::EventsProcessor>>
  ::
  unique_ptr<solitaire::events::EventsProcessor,std::default_delete<solitaire::events::EventsProcessor>,void>
            ((unique_ptr<solitaire::events::interfaces::EventsProcessor,std::default_delete<solitaire::events::interfaces::EventsProcessor>>
              *)this,local_28);
  std::
  unique_ptr<solitaire::events::EventsProcessor,_std::default_delete<solitaire::events::EventsProcessor>_>
  ::~unique_ptr(local_28);
  std::
  unique_ptr<solitaire::events::SDLEventsSource,_std::default_delete<solitaire::events::SDLEventsSource>_>
  ::~unique_ptr((unique_ptr<solitaire::events::SDLEventsSource,_std::default_delete<solitaire::events::SDLEventsSource>_>
                 *)&local_30);
  std::unique_ptr<solitaire::SDL::Wrapper,_std::default_delete<solitaire::SDL::Wrapper>_>::
  ~unique_ptr(&local_38);
  return (__uniq_ptr_data<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>,_true,_true>
          )(__uniq_ptr_data<solitaire::events::interfaces::EventsProcessor,_std::default_delete<solitaire::events::interfaces::EventsProcessor>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<events::interfaces::EventsProcessor>
ApplicationFactory::makeEventsProcessor(
    solitaire::interfaces::Context& context) const
{
    return std::make_unique<EventsProcessor>(
        context,
        std::make_unique<SDLEventsSource>(
            std::make_unique<SDL::Wrapper>()
        )
    );
}